

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

bool __thiscall
serialize_tests::CSerializeMethodsTestSingle::operator==
          (CSerializeMethodsTestSingle *this,CSerializeMethodsTestSingle *rhs)

{
  long lVar1;
  __type_conflict _Var2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->intval == rhs->intval) && (this->boolval == rhs->boolval)) {
    _Var2 = std::operator==(&this->stringval,&rhs->stringval);
    if (_Var2) {
      iVar4 = strcmp(this->charstrval,rhs->charstrval);
      if (iVar4 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          bVar3 = transaction_identifier<false>::operator==
                            (&((this->txval).
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->hash,
                             &((rhs->txval).
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->hash);
          return bVar3;
        }
        goto LAB_004f795b;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
LAB_004f795b:
  __stack_chk_fail();
}

Assistant:

bool operator==(const CSerializeMethodsTestSingle& rhs) const
    {
        return intval == rhs.intval &&
               boolval == rhs.boolval &&
               stringval == rhs.stringval &&
               strcmp(charstrval, rhs.charstrval) == 0 &&
               *txval == *rhs.txval;
    }